

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_quaternion.c
# Opt level: O3

char * test_vector3_rotate_by_quaternion_yx_quarter_turn(void)

{
  int iVar1;
  vector3 *pvVar2;
  char *pcVar3;
  vector3 r;
  quaternion q;
  vector3 local_2c;
  quaternion local_20;
  
  pvVar2 = vector3_get_reference_vector3(1);
  quaternion_set_from_axis_anglev3(&local_20,pvVar2,1.5707964);
  pvVar2 = vector3_get_reference_vector3(2);
  pvVar2 = vector3_set(&local_2c,pvVar2);
  vector3_rotate_by_quaternion(pvVar2,&local_20);
  pvVar2 = vector3_get_reference_vector3(3);
  iVar1 = vector3_equals(&local_2c,pvVar2);
  pcVar3 = (char *)0x0;
  if (iVar1 == 0) {
    pcVar3 = 
    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(149) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(3))))"
    ;
  }
  return pcVar3;
}

Assistant:

static char *test_vector3_rotate_by_quaternion_yx_quarter_turn(void)
{
	struct quaternion q;
	struct vector3 r;

	quaternion_set_from_axis_anglev3(&q, HYP_VECTOR3_UNIT_X, HYP_TAU / 4.0f);
	vector3_rotate_by_quaternion(vector3_set(&r, HYP_VECTOR3_UNIT_Y), &q);
	test_assert(vector3_equals(&r, HYP_VECTOR3_UNIT_Z));

	return NULL;
}